

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIsComplete.cpp
# Opt level: O0

void anon_unknown.dwarf_138623::writeFiles
               (char *completeScanLinesName,char *incompleteScanLinesName,char *completeTilesName,
               char *incompleteTilesName,int width,int height,int tileXSize,int tileYSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  Rgba *pRVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  TiledRgbaOutputFile out_3;
  TiledRgbaOutputFile out_2;
  RgbaOutputFile out_1;
  RgbaOutputFile out;
  int x;
  int y;
  Array2D<Imf_3_4::Rgba> pixels;
  float in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  long in_stack_fffffffffffffe78;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffe80;
  Vec2<float> local_e8;
  Rgba local_e0 [3];
  Vec2<float> local_c8;
  Rgba local_c0 [3];
  Vec2<float> local_a8;
  Rgba local_a0 [3];
  Vec2<float> local_88;
  Rgba local_80 [5];
  half local_58;
  half local_56;
  half local_54;
  half local_52;
  Rgba local_50;
  int local_48;
  int local_44;
  Array2D<Imf_3_4::Rgba> local_40;
  int local_28;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  for (local_44 = 0; iVar4 = local_24, iVar3 = local_28, local_44 < local_28;
      local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < local_24; local_48 = local_48 + 1) {
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe2c);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe2c);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe2c);
      Imath_3_2::half::half
                ((half *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe2c);
      Imf_3_4::Rgba::Rgba(&local_50,local_52,local_54,local_56,local_58);
      pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,(long)local_44);
      pRVar5[local_48] = local_50;
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_88,0.0,0.0);
  uVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,local_80,local_8,iVar4,iVar3,0xf,&local_88,0,4,uVar1);
  pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,0);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_80,(ulong)pRVar5,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_80);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_80);
  iVar4 = local_24;
  iVar3 = local_28;
  Imath_3_2::Vec2<float>::Vec2(&local_a8,0.0,0.0);
  uVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,local_a0,local_10,iVar4,iVar3,0xf,&local_a8,0,4,uVar1);
  pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,0);
  Imf_3_4::RgbaOutputFile::setFrameBuffer(local_a0,(ulong)pRVar5,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)local_a0);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)local_a0);
  iVar4 = local_24;
  iVar3 = local_28;
  uVar1 = in_stack_00000010;
  Imath_3_2::Vec2<float>::Vec2(&local_c8,0.0,0.0);
  uVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_c0,local_18,iVar4,iVar3,in_stack_00000008,uVar1
             ,0,0,0xf,&local_c8,0,3,uVar2);
  pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,0);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_c0,(ulong)pRVar5,1);
  iVar3 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_c0);
  iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_c0);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_c0,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_c0);
  Imath_3_2::Vec2<float>::Vec2(&local_e8,0.0,0.0);
  uVar1 = Imf_3_4::globalThreadCount();
  uVar2 = 0;
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_e0,local_20,local_24,local_28,in_stack_00000008
             ,in_stack_00000010,0,0,0xf,&local_e8,0,3,uVar1);
  pRVar5 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](&local_40,0);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_e0,(ulong)pRVar5,1);
  iVar3 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_e0);
  iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_e0);
  Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_e0,0,iVar3 + -1,0,iVar4 + -2);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_e0);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::~Array2D
            ((Array2D<Imf_3_4::Rgba> *)CONCAT44(in_stack_fffffffffffffe34,uVar2));
  return;
}

Assistant:

void
writeFiles (
    const char completeScanLinesName[],
    const char incompleteScanLinesName[],
    const char completeTilesName[],
    const char incompleteTilesName[],
    int        width,
    int        height,
    int        tileXSize,
    int        tileYSize)
{
    Array2D<Rgba> pixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            pixels[y][x] = Rgba (x, y, 0.0, 1.0);

    {
        RgbaOutputFile out (completeScanLinesName, width, height);
        out.setFrameBuffer (&pixels[0][0], 1, width);
        out.writePixels (height);
    }

    {
        RgbaOutputFile out (incompleteScanLinesName, width, height);
        out.setFrameBuffer (&pixels[0][0], 1, width);
        out.writePixels (height - 1);
    }

    {
        TiledRgbaOutputFile out (
            completeTilesName, width, height, tileXSize, tileYSize, ONE_LEVEL);

        out.setFrameBuffer (&pixels[0][0], 1, width);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    {
        TiledRgbaOutputFile out (
            incompleteTilesName,
            width,
            height,
            tileXSize,
            tileYSize,
            ONE_LEVEL);

        out.setFrameBuffer (&pixels[0][0], 1, width);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 2);
    }
}